

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe.cc
# Opt level: O0

bool __thiscall
bloaty::pe::PEObjectFile::GetDisassemblyInfo
          (PEObjectFile *this,string_view param_2,DataSource param_3,DisassemblyInfo *param_4)

{
  undefined8 uVar1;
  char *in_stack_ffffffffffffff98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  string local_48 [8];
  string_view in_stack_ffffffffffffffc0;
  
  if (0 < verbose_level) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    absl::Substitute_abi_cxx11_(in_stack_ffffffffffffffc0);
    uVar1 = std::__cxx11::string::c_str();
    printf("WARNING: %s\n",uVar1);
    std::__cxx11::string::~string(local_48);
  }
  return false;
}

Assistant:

bool GetDisassemblyInfo(string_view /*symbol*/, DataSource /*symbol_source*/,
                          DisassemblyInfo* /*info*/) const override {
    WARN("PE files do not support disassembly yet");
    return false;
  }